

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void SHA256_Transform(SHA256_CTX *c,uchar *data)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint auStack_164 [7];
  uint local_148 [4];
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128 [64];
  
  lVar4 = 0;
  do {
    uVar6 = *(uint *)(data + lVar4 * 4);
    local_148[lVar4 + 8] =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  lVar4 = 0x10;
  uVar6 = local_128[0];
  do {
    uVar14 = auStack_164[lVar4];
    uVar5 = local_148[lVar4 + 6];
    local_148[lVar4 + 8] =
         (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7)) + uVar6 +
         (uVar5 >> 10 ^ (uVar5 << 0xd | uVar5 >> 0x13) ^ (uVar5 << 0xf | uVar5 >> 0x11)) +
         local_148[lVar4 + 1];
    lVar4 = lVar4 + 1;
    uVar6 = uVar14;
  } while (lVar4 != 0x40);
  local_138 = (uint)*(undefined8 *)(c->h + 4);
  uStack_134 = (uint)((ulong)*(undefined8 *)(c->h + 4) >> 0x20);
  uStack_130 = (uint)*(undefined8 *)(c->h + 6);
  uVar6 = (uStack_130 ^ uStack_134) & local_138 ^ uStack_130;
  uStack_12c = (uint)((ulong)*(undefined8 *)(c->h + 6) >> 0x20);
  iVar9 = ((local_138 << 7 | local_138 >> 0x19) ^
          (local_138 << 0x15 | local_138 >> 0xb) ^ (local_138 << 0x1a | local_138 >> 6)) +
          uStack_12c + local_128[0];
  local_148[0] = (uint)*(undefined8 *)c->h;
  local_148[1] = (uint)((ulong)*(undefined8 *)c->h >> 0x20);
  local_148[3] = (uint)((ulong)*(undefined8 *)(c->h + 2) >> 0x20);
  local_148[3] = uVar6 + iVar9 + 0x428a2f98 + local_148[3];
  local_148[2] = (uint)*(undefined8 *)(c->h + 2);
  uVar14 = (local_148[3] * 0x80 | local_148[3] >> 0x19) ^
           (local_148[3] * 0x200000 | local_148[3] >> 0xb) ^
           (local_148[3] * 0x4000000 | local_148[3] >> 6);
  iVar3 = uStack_130 + local_128[1] + ((uStack_134 ^ local_138) & local_148[3] ^ uStack_134);
  uVar10 = iVar3 + uVar14 + local_148[2] + 0x71374491;
  uVar11 = iVar9 + uVar6 +
           ((local_148[0] << 10 | local_148[0] >> 0x16) ^
           (local_148[0] << 0x13 | local_148[0] >> 0xd) ^ (local_148[0] << 0x1e | local_148[0] >> 2)
           ) + 0x428a2f98 +
           (local_148[2] & local_148[1] | (local_148[2] | local_148[1]) & local_148[0]);
  uVar15 = (uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6);
  iVar9 = uStack_134 + local_128[2] + ((local_148[3] ^ local_138) & uVar10 ^ local_138);
  uVar5 = iVar9 + uVar15 + local_148[1] + 0xb5c0fbcf;
  uVar6 = (local_148[1] & local_148[0] | (local_148[1] | local_148[0]) & uVar11) +
          ((uVar11 * 0x400 | uVar11 >> 0x16) ^
          (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) +
          uVar14 + iVar3 + 0x71374491;
  uVar15 = (uVar11 & local_148[0] | (uVar11 | local_148[0]) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) +
           uVar15 + iVar9 + -0x4a3f0431;
  uVar14 = (uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6);
  iVar3 = local_138 + local_128[3] + ((uVar10 ^ local_148[3]) & uVar5 ^ local_148[3]);
  uVar7 = (uVar6 & uVar11 | (uVar6 | uVar11) & uVar15) +
          ((uVar15 * 0x400 | uVar15 >> 0x16) ^
          (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) +
          iVar3 + uVar14 + -0x164a245b;
  uVar12 = iVar3 + uVar14 + local_148[0] + 0xe9b5dba5;
  iVar3 = local_148[3] + local_128[4] + ((uVar5 ^ uVar10) & uVar12 ^ uVar10) +
          ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) + 0x3956c25b;
  uVar11 = uVar11 + iVar3;
  uVar8 = (uVar15 & uVar6 | (uVar15 | uVar6) & uVar7) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = uVar10 + local_128[5] + ((uVar12 ^ uVar5) & uVar11 ^ uVar5) +
          ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) + 0x59f111f1;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar7 & uVar15 | (uVar7 | uVar15) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar5 + local_128[6] + ((uVar11 ^ uVar12) & uVar6 ^ uVar12) + -0x6dc07d5c;
  uVar15 = uVar15 + iVar3;
  uVar5 = (uVar8 & uVar7 | (uVar8 | uVar7) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar12 + local_128[7] + ((uVar6 ^ uVar11) & uVar15 ^ uVar11) + -0x54e3a12b;
  uVar7 = uVar7 + iVar3;
  uVar10 = (uVar14 & uVar8 | (uVar14 | uVar8) & uVar5) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar11 + local_128[8] + ((uVar15 ^ uVar6) & uVar7 ^ uVar6) + -0x27f85568;
  uVar8 = uVar8 + iVar3;
  uVar11 = (uVar5 & uVar14 | (uVar5 | uVar14) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar6 + local_128[9] + ((uVar7 ^ uVar15) & uVar8 ^ uVar15) + 0x12835b01;
  uVar14 = uVar14 + iVar3;
  uVar6 = (uVar10 & uVar5 | (uVar10 | uVar5) & uVar11) +
          ((uVar11 * 0x400 | uVar11 >> 0x16) ^
          (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[10] + ((uVar8 ^ uVar7) & uVar14 ^ uVar7) + 0x243185be;
  uVar5 = uVar5 + iVar3;
  uVar15 = (uVar11 & uVar10 | (uVar11 | uVar10) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
          uVar7 + local_128[0xb] + ((uVar14 ^ uVar8) & uVar5 ^ uVar8) + 0x550c7dc3;
  uVar10 = uVar10 + iVar3;
  uVar7 = (uVar6 & uVar11 | (uVar6 | uVar11) & uVar15) +
          ((uVar15 * 0x400 | uVar15 >> 0x16) ^
          (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar8 + local_128[0xc] + ((uVar5 ^ uVar14) & uVar10 ^ uVar14) + 0x72be5d74;
  uVar11 = uVar11 + iVar3;
  uVar8 = (uVar15 & uVar6 | (uVar15 | uVar6) & uVar7) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar14 + local_128[0xd] + ((uVar10 ^ uVar5) & uVar11 ^ uVar5) + -0x7f214e02;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar7 & uVar15 | (uVar7 | uVar15) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar5 + local_128[0xe] + ((uVar11 ^ uVar10) & uVar6 ^ uVar10) + -0x6423f959;
  uVar15 = uVar15 + iVar3;
  uVar5 = (uVar8 & uVar7 | (uVar8 | uVar7) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar10 + local_128[0xf] + ((uVar6 ^ uVar11) & uVar15 ^ uVar11) + -0x3e640e8c;
  uVar7 = uVar7 + iVar3;
  uVar10 = (uVar14 & uVar8 | (uVar14 | uVar8) & uVar5) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar11 + local_128[0x10] + ((uVar15 ^ uVar6) & uVar7 ^ uVar6) + -0x1b64963f;
  uVar8 = uVar8 + iVar3;
  uVar12 = (uVar5 & uVar14 | (uVar5 | uVar14) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar6 + local_128[0x11] + ((uVar7 ^ uVar15) & uVar8 ^ uVar15) + -0x1041b87a;
  uVar14 = uVar14 + iVar3;
  uVar6 = (uVar10 & uVar5 | (uVar10 | uVar5) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[0x12] + ((uVar8 ^ uVar7) & uVar14 ^ uVar7) + 0xfc19dc6;
  uVar5 = uVar5 + iVar3;
  uVar15 = (uVar12 & uVar10 | (uVar12 | uVar10) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
          uVar7 + local_128[0x13] + ((uVar14 ^ uVar8) & uVar5 ^ uVar8) + 0x240ca1cc;
  uVar10 = uVar10 + iVar3;
  uVar7 = (uVar6 & uVar12 | (uVar6 | uVar12) & uVar15) +
          ((uVar15 * 0x400 | uVar15 >> 0x16) ^
          (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar8 + local_128[0x14] + ((uVar5 ^ uVar14) & uVar10 ^ uVar14) + 0x2de92c6f;
  uVar12 = uVar12 + iVar3;
  uVar8 = (uVar15 & uVar6 | (uVar15 | uVar6) & uVar7) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar14 + local_128[0x15] + ((uVar10 ^ uVar5) & uVar12 ^ uVar5) + 0x4a7484aa;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar7 & uVar15 | (uVar7 | uVar15) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar5 + local_128[0x16] + ((uVar12 ^ uVar10) & uVar6 ^ uVar10) + 0x5cb0a9dc;
  uVar15 = uVar15 + iVar3;
  uVar5 = (uVar8 & uVar7 | (uVar8 | uVar7) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar10 + local_128[0x17] + ((uVar6 ^ uVar12) & uVar15 ^ uVar12) + 0x76f988da;
  uVar7 = uVar7 + iVar3;
  uVar11 = (uVar14 & uVar8 | (uVar14 | uVar8) & uVar5) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar12 + local_128[0x18] + ((uVar15 ^ uVar6) & uVar7 ^ uVar6) + -0x67c1aeae;
  uVar8 = uVar8 + iVar3;
  uVar12 = (uVar5 & uVar14 | (uVar5 | uVar14) & uVar11) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar6 + local_128[0x19] + ((uVar7 ^ uVar15) & uVar8 ^ uVar15) + -0x57ce3993;
  uVar14 = uVar14 + iVar3;
  uVar6 = (uVar11 & uVar5 | (uVar11 | uVar5) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[0x1a] + ((uVar8 ^ uVar7) & uVar14 ^ uVar7) + -0x4ffcd838;
  uVar5 = uVar5 + iVar3;
  uVar15 = (uVar12 & uVar11 | (uVar12 | uVar11) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
          uVar7 + local_128[0x1b] + ((uVar14 ^ uVar8) & uVar5 ^ uVar8) + -0x40a68039;
  uVar11 = uVar11 + iVar3;
  uVar7 = (uVar6 & uVar12 | (uVar6 | uVar12) & uVar15) +
          ((uVar15 * 0x400 | uVar15 >> 0x16) ^
          (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar8 + local_128[0x1c] + ((uVar5 ^ uVar14) & uVar11 ^ uVar14) + -0x391ff40d;
  uVar12 = uVar12 + iVar3;
  uVar10 = (uVar15 & uVar6 | (uVar15 | uVar6) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar14 + local_128[0x1d] + ((uVar11 ^ uVar5) & uVar12 ^ uVar5) + -0x2a586eb9;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar7 & uVar15 | (uVar7 | uVar15) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar5 + local_128[0x1e] + ((uVar12 ^ uVar11) & uVar6 ^ uVar11) + 0x6ca6351;
  uVar15 = uVar15 + iVar3;
  uVar5 = (uVar10 & uVar7 | (uVar10 | uVar7) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar11 + local_128[0x1f] + ((uVar6 ^ uVar12) & uVar15 ^ uVar12) + 0x14292967;
  uVar7 = uVar7 + iVar3;
  uVar11 = (uVar14 & uVar10 | (uVar14 | uVar10) & uVar5) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar12 + local_128[0x20] + ((uVar15 ^ uVar6) & uVar7 ^ uVar6) + 0x27b70a85;
  uVar10 = uVar10 + iVar3;
  uVar12 = (uVar5 & uVar14 | (uVar5 | uVar14) & uVar11) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar3;
  iVar3 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar6 + local_128[0x21] + ((uVar7 ^ uVar15) & uVar10 ^ uVar15) + 0x2e1b2138;
  uVar14 = uVar14 + iVar3;
  uVar6 = (uVar11 & uVar5 | (uVar11 | uVar5) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[0x22] + ((uVar10 ^ uVar7) & uVar14 ^ uVar7) + 0x4d2c6dfc;
  uVar5 = uVar5 + iVar3;
  uVar15 = (uVar12 & uVar11 | (uVar12 | uVar11) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
          uVar7 + local_128[0x23] + ((uVar14 ^ uVar10) & uVar5 ^ uVar10) + 0x53380d13;
  uVar11 = uVar11 + iVar3;
  uVar8 = (uVar6 & uVar12 | (uVar6 | uVar12) & uVar15) +
          ((uVar15 * 0x400 | uVar15 >> 0x16) ^
          (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar10 + local_128[0x24] + ((uVar5 ^ uVar14) & uVar11 ^ uVar14) + 0x650a7354;
  uVar12 = uVar12 + iVar3;
  uVar10 = (uVar15 & uVar6 | (uVar15 | uVar6) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar14 + local_128[0x25] + ((uVar11 ^ uVar5) & uVar12 ^ uVar5) + 0x766a0abb;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar8 & uVar15 | (uVar8 | uVar15) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar5 + local_128[0x26] + ((uVar12 ^ uVar11) & uVar6 ^ uVar11) + -0x7e3d36d2;
  uVar15 = uVar15 + iVar3;
  uVar5 = (uVar10 & uVar8 | (uVar10 | uVar8) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar11 + local_128[0x27] + ((uVar6 ^ uVar12) & uVar15 ^ uVar12) + -0x6d8dd37b;
  uVar8 = uVar8 + iVar3;
  uVar11 = (uVar14 & uVar10 | (uVar14 | uVar10) & uVar5) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar12 + local_128[0x28] + ((uVar15 ^ uVar6) & uVar8 ^ uVar6) + -0x5d40175f;
  uVar10 = uVar10 + iVar3;
  uVar12 = (uVar5 & uVar14 | (uVar5 | uVar14) & uVar11) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar3;
  iVar3 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar6 + local_128[0x29] + ((uVar8 ^ uVar15) & uVar10 ^ uVar15) + -0x57e599b5;
  uVar14 = uVar14 + iVar3;
  uVar6 = (uVar11 & uVar5 | (uVar11 | uVar5) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[0x2a] + ((uVar10 ^ uVar8) & uVar14 ^ uVar8) + -0x3db47490;
  uVar5 = uVar5 + iVar3;
  uVar7 = (uVar12 & uVar11 | (uVar12 | uVar11) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = uVar8 + local_128[0x2b] + ((uVar14 ^ uVar10) & uVar5 ^ uVar10) +
          ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + -0x3893ae5d;
  uVar11 = uVar11 + iVar3;
  uVar15 = (uVar6 & uVar12 | (uVar6 | uVar12) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar10 + local_128[0x2c] + ((uVar5 ^ uVar14) & uVar11 ^ uVar14) + -0x2e6d17e7;
  uVar12 = uVar12 + iVar3;
  uVar10 = (uVar7 & uVar6 | (uVar7 | uVar6) & uVar15) +
           ((uVar15 * 0x400 | uVar15 >> 0x16) ^
           (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar14 + local_128[0x2d] + ((uVar11 ^ uVar5) & uVar12 ^ uVar5) + -0x2966f9dc;
  uVar6 = uVar6 + iVar3;
  uVar14 = (uVar15 & uVar7 | (uVar15 | uVar7) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = uVar5 + local_128[0x2e] + ((uVar12 ^ uVar11) & uVar6 ^ uVar11) +
          ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) + -0xbf1ca7b;
  uVar7 = uVar7 + iVar3;
  uVar8 = (uVar10 & uVar15 | (uVar10 | uVar15) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar11 + local_128[0x2f] + ((uVar6 ^ uVar12) & uVar7 ^ uVar12) + 0x106aa070;
  uVar15 = uVar15 + iVar3;
  uVar11 = (uVar14 & uVar10 | (uVar14 | uVar10) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar12 + local_128[0x30] + ((uVar7 ^ uVar6) & uVar15 ^ uVar6) + 0x19a4c116;
  uVar10 = uVar10 + iVar3;
  uVar12 = (uVar8 & uVar14 | (uVar8 | uVar14) & uVar11) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar3;
  iVar3 = uVar6 + local_128[0x31] + ((uVar15 ^ uVar7) & uVar10 ^ uVar7) +
          ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0x1e376c08;
  uVar14 = uVar14 + iVar3;
  uVar5 = (uVar11 & uVar8 | (uVar11 | uVar8) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar7 + local_128[0x32] + ((uVar10 ^ uVar15) & uVar14 ^ uVar15) + 0x2748774c;
  uVar8 = uVar8 + iVar3;
  uVar7 = (uVar12 & uVar11 | (uVar12 | uVar11) & uVar5) +
          ((uVar5 * 0x400 | uVar5 >> 0x16) ^
          (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar15 + local_128[0x33] + ((uVar14 ^ uVar10) & uVar8 ^ uVar10) + 0x34b0bcb5;
  uVar11 = uVar11 + iVar3;
  uVar15 = (uVar5 & uVar12 | (uVar5 | uVar12) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar10 + local_128[0x34] + ((uVar8 ^ uVar14) & uVar11 ^ uVar14) + 0x391c0cb3;
  uVar12 = uVar12 + iVar3;
  uVar10 = (uVar7 & uVar5 | (uVar7 | uVar5) & uVar15) +
           ((uVar15 * 0x400 | uVar15 >> 0x16) ^
           (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar14 + local_128[0x35] + ((uVar11 ^ uVar8) & uVar12 ^ uVar8) + 0x4ed8aa4a;
  uVar5 = uVar5 + iVar3;
  uVar13 = (uVar15 & uVar7 | (uVar15 | uVar7) & uVar10) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar3;
  iVar3 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
          uVar8 + local_128[0x36] + ((uVar12 ^ uVar11) & uVar5 ^ uVar11) + 0x5b9cca4f;
  uVar7 = uVar7 + iVar3;
  uVar14 = (uVar10 & uVar15 | (uVar10 | uVar15) & uVar13) +
           ((uVar13 * 0x400 | uVar13 >> 0x16) ^
           (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar3;
  iVar3 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar11 + local_128[0x37] + ((uVar5 ^ uVar12) & uVar7 ^ uVar12) + 0x682e6ff3;
  uVar15 = uVar15 + iVar3;
  uVar6 = (uVar13 & uVar10 | (uVar13 | uVar10) & uVar14) +
          ((uVar14 * 0x400 | uVar14 >> 0x16) ^
          (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar3;
  iVar3 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar12 + local_128[0x38] + ((uVar7 ^ uVar5) & uVar15 ^ uVar5) + 0x748f82ee;
  uVar10 = uVar10 + iVar3;
  uVar8 = (uVar14 & uVar13 | (uVar14 | uVar13) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar3;
  iVar3 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar5 + local_128[0x39] + ((uVar15 ^ uVar7) & uVar10 ^ uVar7) + 0x78a5636f;
  uVar13 = uVar13 + iVar3;
  uVar5 = (uVar6 & uVar14 | (uVar6 | uVar14) & uVar8) +
          ((uVar8 * 0x400 | uVar8 >> 0x16) ^
          (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar3;
  iVar3 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar7 + local_128[0x3a] + ((uVar10 ^ uVar15) & uVar13 ^ uVar15) + -0x7b3787ec;
  uVar14 = uVar14 + iVar3;
  uVar7 = (uVar8 & uVar6 | (uVar8 | uVar6) & uVar5) +
          ((uVar5 * 0x400 | uVar5 >> 0x16) ^
          (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar3;
  iVar3 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
          (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
          uVar15 + local_128[0x3b] + ((uVar13 ^ uVar10) & uVar14 ^ uVar10) + -0x7338fdf8;
  uVar6 = uVar6 + iVar3;
  uVar15 = (uVar5 & uVar8 | (uVar5 | uVar8) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar3;
  iVar3 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar10 + local_128[0x3c] + ((uVar14 ^ uVar13) & uVar6 ^ uVar13) + -0x6f410006;
  uVar8 = uVar8 + iVar3;
  local_148[3] = (uVar7 & uVar5 | (uVar7 | uVar5) & uVar15) +
                 ((uVar15 * 0x400 | uVar15 >> 0x16) ^
                 (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar3;
  iVar3 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar13 + local_128[0x3d] + ((uVar6 ^ uVar14) & uVar8 ^ uVar14) + -0x5baf9315;
  uVar5 = uVar5 + iVar3;
  _uStack_130 = CONCAT44(uVar8,uVar5);
  local_148[2] = (uVar15 & uVar7 | (uVar15 | uVar7) & local_148[3]) +
                 ((local_148[3] * 0x400 | local_148[3] >> 0x16) ^
                 (local_148[3] * 0x80000 | local_148[3] >> 0xd) ^
                 (local_148[3] * 0x40000000 | local_148[3] >> 2)) + iVar3;
  iVar3 = uVar14 + local_128[0x3e] + ((uVar8 ^ uVar6) & uVar5 ^ uVar6) +
          ((uVar5 * 0x80 | uVar5 >> 0x19) ^
          (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + -0x41065c09;
  uVar7 = uVar7 + iVar3;
  local_148[1] = (local_148[3] & uVar15 | (local_148[3] | uVar15) & local_148[2]) +
                 ((local_148[2] * 0x400 | local_148[2] >> 0x16) ^
                 (local_148[2] * 0x80000 | local_148[2] >> 0xd) ^
                 (local_148[2] * 0x40000000 | local_148[2] >> 2)) + iVar3;
  iVar3 = uVar6 + local_128[0x3f] + ((uVar5 ^ uVar8) & uVar7 ^ uVar8) +
          ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) + -0x398e870e;
  _local_138 = CONCAT44(uVar7,uVar15 + iVar3);
  local_148[0] = (local_148[2] & local_148[3] | (local_148[2] | local_148[3]) & local_148[1]) +
                 ((local_148[1] * 0x400 | local_148[1] >> 0x16) ^
                 (local_148[1] * 0x80000 | local_148[1] >> 0xd) ^
                 (local_148[1] * 0x40000000 | local_148[1] >> 2)) + iVar3;
  lVar4 = 0;
  do {
    puVar1 = c->h + lVar4;
    uVar6 = puVar1[1];
    uVar14 = puVar1[2];
    uVar5 = puVar1[3];
    uVar15 = local_148[lVar4 + 1];
    uVar7 = local_148[lVar4 + 2];
    uVar8 = local_148[lVar4 + 3];
    puVar2 = c->h + lVar4;
    *puVar2 = *puVar1 + local_148[lVar4];
    puVar2[1] = uVar6 + uVar15;
    puVar2[2] = uVar14 + uVar7;
    puVar2[3] = uVar5 + uVar8;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 8);
  return;
}

Assistant:

static void
SHA256_Transform(uint32_t * state, const unsigned char block[64])
{
	uint32_t W[64];
	uint32_t S[8];
	uint32_t t0, t1;
	int i;

	/* 1. Prepare message schedule W. */
	be32dec_vect(W, block, 64);
	for (i = 16; i < 64; i++)
		W[i] = s1(W[i - 2]) + W[i - 7] + s0(W[i - 15]) + W[i - 16];

	/* 2. Initialize working variables. */
	memcpy(S, state, 32);

	/* 3. Mix. */
	RNDr(S, W, 0, 0x428a2f98);
	RNDr(S, W, 1, 0x71374491);
	RNDr(S, W, 2, 0xb5c0fbcf);
	RNDr(S, W, 3, 0xe9b5dba5);
	RNDr(S, W, 4, 0x3956c25b);
	RNDr(S, W, 5, 0x59f111f1);
	RNDr(S, W, 6, 0x923f82a4);
	RNDr(S, W, 7, 0xab1c5ed5);
	RNDr(S, W, 8, 0xd807aa98);
	RNDr(S, W, 9, 0x12835b01);
	RNDr(S, W, 10, 0x243185be);
	RNDr(S, W, 11, 0x550c7dc3);
	RNDr(S, W, 12, 0x72be5d74);
	RNDr(S, W, 13, 0x80deb1fe);
	RNDr(S, W, 14, 0x9bdc06a7);
	RNDr(S, W, 15, 0xc19bf174);
	RNDr(S, W, 16, 0xe49b69c1);
	RNDr(S, W, 17, 0xefbe4786);
	RNDr(S, W, 18, 0x0fc19dc6);
	RNDr(S, W, 19, 0x240ca1cc);
	RNDr(S, W, 20, 0x2de92c6f);
	RNDr(S, W, 21, 0x4a7484aa);
	RNDr(S, W, 22, 0x5cb0a9dc);
	RNDr(S, W, 23, 0x76f988da);
	RNDr(S, W, 24, 0x983e5152);
	RNDr(S, W, 25, 0xa831c66d);
	RNDr(S, W, 26, 0xb00327c8);
	RNDr(S, W, 27, 0xbf597fc7);
	RNDr(S, W, 28, 0xc6e00bf3);
	RNDr(S, W, 29, 0xd5a79147);
	RNDr(S, W, 30, 0x06ca6351);
	RNDr(S, W, 31, 0x14292967);
	RNDr(S, W, 32, 0x27b70a85);
	RNDr(S, W, 33, 0x2e1b2138);
	RNDr(S, W, 34, 0x4d2c6dfc);
	RNDr(S, W, 35, 0x53380d13);
	RNDr(S, W, 36, 0x650a7354);
	RNDr(S, W, 37, 0x766a0abb);
	RNDr(S, W, 38, 0x81c2c92e);
	RNDr(S, W, 39, 0x92722c85);
	RNDr(S, W, 40, 0xa2bfe8a1);
	RNDr(S, W, 41, 0xa81a664b);
	RNDr(S, W, 42, 0xc24b8b70);
	RNDr(S, W, 43, 0xc76c51a3);
	RNDr(S, W, 44, 0xd192e819);
	RNDr(S, W, 45, 0xd6990624);
	RNDr(S, W, 46, 0xf40e3585);
	RNDr(S, W, 47, 0x106aa070);
	RNDr(S, W, 48, 0x19a4c116);
	RNDr(S, W, 49, 0x1e376c08);
	RNDr(S, W, 50, 0x2748774c);
	RNDr(S, W, 51, 0x34b0bcb5);
	RNDr(S, W, 52, 0x391c0cb3);
	RNDr(S, W, 53, 0x4ed8aa4a);
	RNDr(S, W, 54, 0x5b9cca4f);
	RNDr(S, W, 55, 0x682e6ff3);
	RNDr(S, W, 56, 0x748f82ee);
	RNDr(S, W, 57, 0x78a5636f);
	RNDr(S, W, 58, 0x84c87814);
	RNDr(S, W, 59, 0x8cc70208);
	RNDr(S, W, 60, 0x90befffa);
	RNDr(S, W, 61, 0xa4506ceb);
	RNDr(S, W, 62, 0xbef9a3f7);
	RNDr(S, W, 63, 0xc67178f2);

	/* 4. Mix local working variables into global state */
	for (i = 0; i < 8; i++)
		state[i] += S[i];

	/* Clean the stack. */
	memset(W, 0, 256);
	memset(S, 0, 32);
	t0 = t1 = 0;
}